

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_double<long_double,fmt::FormatSpec>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  Alignment AVar1;
  wchar_t wVar2;
  Buffer<char> *pBVar3;
  unkbyte10 Var4;
  CharTraits<char> CVar5;
  CharTraits<char> CVar6;
  uint uVar7;
  CharTraits<char> *pCVar8;
  undefined2 *puVar9;
  uint uVar10;
  CharTraits<char> CVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  int in_R9D;
  size_t __len;
  ulong __n;
  size_t __len_1;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  bool bVar19;
  char format [10];
  char in_stack_ffffffffffffff6f;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 auStack_4f [7];
  undefined1 local_48 [24];
  
  bVar18 = spec->type_;
  uVar10 = bVar18 - 0x41;
  if (uVar10 < 0x27) {
    if ((0x71UL >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_00125b90;
      goto LAB_00125874;
    }
    bVar19 = true;
  }
  else {
LAB_00125b90:
    if (bVar18 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff6f,
                 (char *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
    }
    bVar18 = 0x67;
LAB_00125874:
    bVar19 = false;
  }
  local_48._0_10_ = value;
  Var4 = local_48._0_10_;
  local_48._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  if ((short)local_48._8_2_ < 0) {
    value = -value;
    CVar11 = (CharTraits<char>)0x2d;
  }
  else if ((spec->flags_ & 1) == 0) {
    CVar11 = (CharTraits<char>)0x0;
  }
  else {
    CVar11 = (CharTraits<char>)0x2b;
    if ((spec->flags_ & 2) == 0) {
      CVar11 = (CharTraits<char>)0x20;
    }
  }
  local_48._0_10_ = Var4;
  if (NAN(value)) {
    pcVar14 = " nan";
    if (bVar19) {
      pcVar14 = " NAN";
    }
    pcVar13 = " nan";
    if (bVar19) {
      pcVar13 = " NAN";
    }
    pcVar13 = pcVar13 + 1;
    if (CVar11 != (CharTraits<char>)0x0) {
      pcVar13 = pcVar14;
    }
    uVar17 = (ulong)(CVar11 != (CharTraits<char>)0x0);
LAB_001258fd:
    pCVar8 = (CharTraits<char> *)write_str<char>(this,pcVar13,uVar17 + 3,&spec->super_AlignSpec);
    if (CVar11 != (CharTraits<char>)0x0) {
      *pCVar8 = CVar11;
    }
    return;
  }
  if ((longdouble)INFINITY <= value) {
    pcVar14 = " inf";
    if (bVar19) {
      pcVar14 = " INF";
    }
    pcVar13 = " inf";
    if (bVar19) {
      pcVar13 = " INF";
    }
    uVar17 = (ulong)(CVar11 != (CharTraits<char>)0x0);
    pcVar13 = pcVar13 + 1;
    if (CVar11 != (CharTraits<char>)0x0) {
      pcVar13 = pcVar14;
    }
    goto LAB_001258fd;
  }
  pBVar3 = this->buffer_;
  sVar15 = pBVar3->size_;
  uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (CVar11 != (CharTraits<char>)0x0) {
    if (pBVar3->capacity_ < (uVar10 + (uVar10 == 0)) + sVar15) {
      (**pBVar3->_vptr_Buffer)();
    }
    bVar19 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if (bVar19) {
      uVar10 = 0;
    }
    sVar15 = sVar15 + 1;
  }
  local_52 = 0x25;
  if ((spec->flags_ & 8) == 0) {
    puVar9 = (undefined2 *)local_51;
  }
  else {
    puVar9 = (undefined2 *)(local_51 + 1);
    local_51[0] = 0x23;
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *(undefined1 *)puVar9 = 0x2d;
      puVar9 = (undefined2 *)((long)puVar9 + 1);
    }
    if (uVar10 != 0) {
      *(undefined1 *)puVar9 = 0x2a;
      puVar9 = (undefined2 *)((long)puVar9 + 1);
      goto LAB_001259ac;
    }
  }
  uVar10 = 0;
LAB_001259ac:
  if (-1 < spec->precision_) {
    *puVar9 = 0x2a2e;
    puVar9 = puVar9 + 1;
  }
  *(undefined1 *)puVar9 = 0x4c;
  *(byte *)((long)puVar9 + 1) = bVar18;
  *(undefined1 *)(puVar9 + 1) = 0;
  wVar2 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  uVar12 = 0;
  do {
    pCVar8 = (CharTraits<char> *)(this->buffer_->ptr_ + sVar15);
    uVar7 = internal::CharTraits<char>::format_float<long_double>
                      (pCVar8,(char *)(this->buffer_->capacity_ - sVar15),(size_t)&local_52,
                       (char *)(ulong)uVar10,spec->precision_,in_R9D,value);
    if ((int)uVar7 < 0) {
      pBVar3 = this->buffer_;
      bVar19 = true;
      uVar7 = uVar12;
      if (pBVar3->capacity_ != 0xffffffffffffffff) {
        (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->capacity_ + 1);
      }
    }
    else {
      uVar17 = this->buffer_->capacity_;
      if (uVar7 + sVar15 < uVar17) {
        bVar19 = false;
      }
      else {
        bVar19 = true;
        if (uVar17 < uVar7 + sVar15 + 1) {
          (**this->buffer_->_vptr_Buffer)();
        }
      }
    }
    uVar12 = uVar7;
  } while (bVar19);
  CVar5 = SUB41(wVar2,0);
  if (CVar11 == (CharTraits<char>)0x0) {
    CVar11 = (CharTraits<char>)0x0;
  }
  else {
    AVar1 = (spec->super_AlignSpec).align_;
    if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
       (CVar6 = CVar5, *pCVar8 != (CharTraits<char>)0x20)) {
      CVar6 = CVar11;
      CVar11 = (CharTraits<char>)0x0;
    }
    pCVar8[-1] = CVar6;
    uVar7 = uVar7 + 1;
  }
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar7 < uVar10) {
      pBVar3 = this->buffer_;
      sVar15 = pBVar3->size_;
      uVar17 = sVar15 + uVar10;
      if (pBVar3->capacity_ < uVar17) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar17);
      }
      pBVar3->size_ = uVar17;
      pcVar14 = this->buffer_->ptr_ + sVar15;
      uVar17 = (ulong)uVar7;
      memmove(pcVar14 + (uVar10 - uVar7 >> 1),pcVar14,uVar17);
      uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar16 = uVar10 - uVar17;
      __n = uVar16 >> 1;
      uVar12 = wVar2 & 0xff;
      if (1 < uVar16) {
        memset(pcVar14,uVar12,__n);
      }
      if (uVar10 == uVar7) {
        return;
      }
      memset(pcVar14 + uVar17 + __n,uVar12,uVar16 - __n);
      return;
    }
  }
  if ((CVar11 != (CharTraits<char>)0x0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' '))
  {
    CVar6 = *pCVar8;
    while (CVar6 == (CharTraits<char>)0x20) {
      *pCVar8 = CVar5;
      CVar6 = pCVar8[1];
      pCVar8 = pCVar8 + 1;
    }
    if (CVar11 != (CharTraits<char>)0x0) {
      pCVar8[-1] = CVar11;
    }
  }
  pBVar3 = this->buffer_;
  uVar17 = (ulong)uVar7 + pBVar3->size_;
  if (pBVar3->capacity_ < uVar17) {
    (**pBVar3->_vptr_Buffer)(pBVar3,uVar17);
  }
  pBVar3->size_ = uVar17;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}